

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_map_sync_write
          (t_rs_generator *this,string *map_var,bool map_var_is_ref,t_map *tmap)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_type *ptVar3;
  t_type *ttype;
  ofstream_with_content_based_conditional_update *poVar4;
  ostream *poVar5;
  char *pcVar6;
  t_rs_generator *ptVar7;
  string ref;
  string local_a0;
  string local_80;
  t_type *local_60;
  string local_58;
  ofstream_with_content_based_conditional_update *local_38;
  
  ptVar3 = tmap->key_type_;
  local_60 = tmap->val_type_;
  t_generator::indent_abi_cxx11_(&local_58,&this->super_t_generator);
  local_38 = &this->f_gen_;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_gen_,local_58._M_dataplus._M_p,local_58._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"o_prot.write_map_begin(",0x17);
  pcVar6 = "&TMapIdentifier::new(";
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"&TMapIdentifier::new(",0x15);
  to_rust_field_type_enum_abi_cxx11_(&local_a0,(t_rs_generator *)pcVar6,ptVar3);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  ttype = local_60;
  ptVar7 = (t_rs_generator *)0x3a9b9f;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  to_rust_field_type_enum_abi_cxx11_(&local_80,ptVar7,ttype);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(map_var->_M_dataplus)._M_p,map_var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".len() as i32)",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")?;",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar2 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pcVar6 = "&";
  if (map_var_is_ref) {
    pcVar6 = "";
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,pcVar6,pcVar6 + !map_var_is_ref);
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar4 = local_38;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_38,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"for (k, v) in ",0xe);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(map_var->_M_dataplus)._M_p,map_var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  ptVar7 = (t_rs_generator *)0x37efb1;
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"k","");
  string_container_write_variable(&local_a0,ptVar7,ptVar3,&local_80);
  render_type_sync_write(this,&local_a0,true,ptVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  ptVar7 = (t_rs_generator *)0x38b299;
  local_80._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"v","");
  ptVar3 = local_60;
  string_container_write_variable(&local_a0,ptVar7,local_60,&local_80);
  render_type_sync_write(this,&local_a0,true,ptVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar4,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_a0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar4,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"o_prot.write_map_end()?;",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::render_map_sync_write(const string &map_var, bool map_var_is_ref, t_map *tmap) {
  t_type* key_type = tmap->get_key_type();
  t_type* val_type = tmap->get_val_type();

  f_gen_
    << indent()
    << "o_prot.write_map_begin("
    << "&TMapIdentifier::new("
    << to_rust_field_type_enum(key_type) << ", "
    << to_rust_field_type_enum(val_type) << ", "
    << map_var << ".len() as i32)"
    << ")?;"
    << endl;

  string ref(map_var_is_ref ? "" : "&");
  f_gen_ << indent() << "for (k, v) in " << ref << map_var << " {" << endl;
  indent_up();
  render_type_sync_write(string_container_write_variable(key_type, "k"), true, key_type);
  render_type_sync_write(string_container_write_variable(val_type, "v"), true, val_type);
  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "o_prot.write_map_end()?;" << endl;
}